

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O2

int32_t uset_getItem_63(USet *uset,int32_t itemIndex,UChar32 *start,UChar32 *end,UChar *str,
                       int32_t strCapacity,UErrorCode *ec)

{
  int32_t iVar1;
  UChar32 UVar2;
  int32_t iVar3;
  UnicodeString *this;
  Char16Ptr local_50;
  UChar *local_48;
  
  if (U_ZERO_ERROR < *ec) {
    return 0;
  }
  if (itemIndex < 0) {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    local_48 = str;
    iVar1 = icu_63::UnicodeSet::getRangeCount((UnicodeSet *)uset);
    if (itemIndex < iVar1) {
      UVar2 = icu_63::UnicodeSet::getRangeStart((UnicodeSet *)uset,itemIndex);
      *start = UVar2;
      UVar2 = icu_63::UnicodeSet::getRangeEnd((UnicodeSet *)uset,itemIndex);
      *end = UVar2;
      return 0;
    }
    iVar3 = icu_63::UnicodeSet::getStringCount((UnicodeSet *)uset);
    if (itemIndex - iVar1 < iVar3) {
      this = icu_63::UnicodeSet::getString((UnicodeSet *)uset,itemIndex - iVar1);
      local_50.p_ = local_48;
      iVar1 = icu_63::UnicodeString::extract(this,&local_50,strCapacity,ec);
      return iVar1;
    }
    *ec = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uset_getItem(const USet* uset, int32_t itemIndex,
             UChar32* start, UChar32* end,
             UChar* str, int32_t strCapacity,
             UErrorCode* ec) {
    if (U_FAILURE(*ec)) return 0;
    const UnicodeSet& set = *(const UnicodeSet*)uset;
    int32_t rangeCount;

    if (itemIndex < 0) {
        *ec = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    } else if (itemIndex < (rangeCount = set.getRangeCount())) {
        *start = set.getRangeStart(itemIndex);
        *end = set.getRangeEnd(itemIndex);
        return 0;
    } else {
        itemIndex -= rangeCount;
        if (itemIndex < USetAccess::getStringCount(set)) {
            const UnicodeString* s = USetAccess::getString(set, itemIndex);
            return s->extract(str, strCapacity, *ec);
        } else {
            *ec = U_INDEX_OUTOFBOUNDS_ERROR;
            return -1;
        }
    }
}